

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip.h
# Opt level: O2

int mixed_pack_finish_write(uint32_t size,mixed_pack *pack)

{
  uint32_t uVar1;
  bool bVar2;
  
  if (size <= pack->reserved) {
    do {
      uVar1 = pack->write;
      LOCK();
      bVar2 = uVar1 == pack->write;
      if (bVar2) {
        pack->write = uVar1 + size;
      }
      UNLOCK();
    } while (!bVar2);
    pack->reserved = 0;
    return 1;
  }
  mixed_err(0x12);
  return 0;
}

Assistant:

static inline int bip_finish_write(uint32_t size, struct bip *buffer){
  if(buffer->reserved < size){
    mixed_err(MIXED_BUFFER_OVERCOMMIT);
    return 0;
  }
 retry: {
    uint32_t write = atomic_read(buffer->write);
    if(!atomic_cas(buffer->write, write, write+size))
      goto retry;
  }
  buffer->reserved = 0;
  return 1;
}